

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_scalar_by_extension
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  REF_CELL pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  size_t sVar7;
  FILE *pFVar8;
  REF_MPI pRVar9;
  long lVar10;
  size_t sVar11;
  undefined8 uVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  int iVar18;
  ulong uVar19;
  REF_STATUS ref_private_macro_code_rxs;
  int iVar20;
  REF_NODE pRVar21;
  undefined8 *puVar22;
  ulong uVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_INT min_id;
  int dof;
  int length;
  int version;
  REF_GLOB nnode;
  uint local_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  uint local_17c;
  REF_DBL *local_178;
  int local_16c;
  ulong local_168;
  FILE *local_160;
  REF_NODE local_158;
  ulong local_150;
  void *local_148;
  uint local_140;
  int local_13c;
  void *local_138;
  ulong local_130;
  REF_MPI local_128;
  uint local_120;
  uint local_11c;
  undefined4 local_118;
  undefined4 local_114;
  long local_110;
  ulong local_108;
  long local_100;
  undefined8 *local_f8;
  ulong local_f0;
  void *local_e8;
  long local_e0;
  ulong local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  long local_b8;
  int local_ac;
  REF_GLOB local_a8;
  undefined1 local_a0;
  
  uVar16 = (ulong)(uint)ldim;
  local_178 = scalar;
  sVar7 = strlen(filename);
  if (9 < sVar7) {
    iVar2 = strcmp(filename + (sVar7 - 9),"-edge.tec");
    if (iVar2 != 0) {
      if ((sVar7 != 10) && (iVar2 = strcmp(filename + (sVar7 - 10),"-brick.plt"), iVar2 == 0)) {
        uVar3 = ref_gather_scalar_plt(ref_grid,ldim,local_178,scalar_names,1,filename);
        if (uVar3 == 0) {
          return 0;
        }
        uVar16 = (ulong)uVar3;
        pcVar17 = "scalar tec";
        uVar12 = 0x111e;
        goto LAB_00135eb3;
      }
      goto LAB_0013570d;
    }
    pRVar9 = ref_grid->mpi;
    pRVar21 = ref_grid->node;
    if (pRVar9->id == 0) {
      pFVar8 = fopen(filename,"w");
      if (pFVar8 != (FILE *)0x0) {
        local_158 = pRVar21;
        fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar8);
        fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar8);
        if (scalar_names == (char **)0x0) {
          if (0 < ldim) {
            uVar16 = 1;
            do {
              fprintf(pFVar8," \"V%d\"",uVar16);
              iVar2 = (int)uVar16;
              uVar16 = (ulong)(iVar2 + 1);
            } while (iVar2 != ldim);
          }
        }
        else if (0 < ldim) {
          uVar15 = 0;
          do {
            fprintf(pFVar8," \"%s\"",scalar_names[uVar15]);
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        fputc(10,pFVar8);
        pRVar21 = local_158;
        goto LAB_00135e12;
      }
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xda1,"ref_gather_scalar_edge_tec","unable to open file");
      uVar16 = 2;
LAB_00135e92:
      pcVar17 = "scalar edge tec";
      uVar12 = 0x1117;
      goto LAB_00135eb3;
    }
    pFVar8 = (FILE *)0x0;
LAB_00135e12:
    uVar3 = ref_node_synchronize_globals(pRVar21);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar17 = "sync";
      uVar12 = 0xdac;
LAB_00135e88:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar12,"ref_gather_scalar_edge_tec",uVar16,pcVar17);
      goto LAB_00135e92;
    }
    pRVar1 = ref_grid->cell[0];
    uVar3 = ref_cell_id_range(pRVar1,pRVar9,(REF_INT *)&local_17c,&local_16c);
    if (uVar3 != 0) {
      uVar16 = (ulong)uVar3;
      pcVar17 = "range";
      uVar12 = 0xdaf;
      goto LAB_00135e88;
    }
    if ((int)local_17c <= local_16c) {
      uVar3 = local_17c;
      do {
        uVar4 = ref_grid_compact_cell_id_nodes
                          (ref_grid,pRVar1,uVar3,&local_a8,(REF_LONG *)&local_190,
                           (REF_GLOB **)&local_188);
        if (uVar4 != 0) {
          uVar16 = (ulong)uVar4;
          pcVar17 = "l2c";
          uVar12 = 0xdb4;
          goto LAB_00135e88;
        }
        if (0 < CONCAT44(uStack_18c,local_190) && 0 < local_a8) {
          if (ref_grid->mpi->id == 0) {
            fprintf(pFVar8,
                    "zone t=\"edg%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    (ulong)uVar3,local_a8,CONCAT44(uStack_18c,local_190),"point","felineseg");
          }
          uVar4 = ref_gather_node_tec_part
                            (pRVar21,local_a8,(REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),
                             ldim,local_178,(FILE *)pFVar8);
          if (uVar4 != 0) {
            uVar16 = (ulong)uVar4;
            pcVar17 = "nodes";
            uVar12 = 0xdbe;
            goto LAB_00135e88;
          }
          uVar4 = ref_gather_cell_id_tec
                            (pRVar21,pRVar1,uVar3,CONCAT44(uStack_18c,local_190),
                             (REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),0,(FILE *)pFVar8);
          if (uVar4 != 0) {
            uVar16 = (ulong)uVar4;
            pcVar17 = "t";
            uVar12 = 0xdc1;
            goto LAB_00135e88;
          }
        }
        if ((void *)CONCAT44(local_188._4_4_,(int)local_188) != (void *)0x0) {
          free((void *)CONCAT44(local_188._4_4_,(int)local_188));
        }
        bVar24 = (int)uVar3 < local_16c;
        uVar3 = uVar3 + 1;
      } while (bVar24);
    }
LAB_001374e7:
    iVar2 = ref_grid->mpi->id;
joined_r0x0013676c:
    if (iVar2 == 0) {
      fclose(pFVar8);
    }
    return 0;
  }
  if (sVar7 < 5) {
    if (sVar7 < 3) goto LAB_00135a7f;
    bVar24 = false;
LAB_0013576a:
    pcVar17 = filename + sVar7;
    if (((filename[sVar7 - 2] != '.') || (pcVar17[-1] != 't')) || (*pcVar17 != '\0')) {
      if (bVar24) {
        iVar2 = strcmp(pcVar17 + -4,".pcd");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar17 + -4,".rst");
          if (iVar2 != 0) goto LAB_001357bf;
          pRVar9 = ref_grid->mpi;
          pRVar21 = ref_grid->node;
          uVar3 = ref_node_synchronize_globals(pRVar21);
          if (uVar3 == 0) {
            local_17c = 2;
            local_190 = ldim / 2;
            uVar3 = ldim - (ldim >> 0x1f) & 0xfffffffe;
            if (uVar3 == ldim) {
              uVar16 = pRVar21->old_n_global;
              local_16c = (int)uVar16;
              if (ref_grid->mpi->id == 0) {
                local_13c = 8;
                local_a8 = 0x5453524546464f43;
                local_a0 = 0;
                local_114 = 2;
                local_118 = 0;
                pFVar8 = fopen(filename,"w");
                if (pFVar8 == (FILE *)0x0) {
                  printf("unable to open %s\n",filename);
                  pcVar17 = "unable to open file";
                  uVar12 = 0x61d;
                  goto LAB_001377b9;
                }
                sVar7 = fwrite(&local_13c,4,1,pFVar8);
                if (sVar7 == 1) {
                  sVar11 = (size_t)local_13c;
                  sVar7 = fwrite(&local_a8,1,sVar11,pFVar8);
                  if (sVar7 == sVar11) {
                    sVar7 = fwrite(&local_114,4,1,pFVar8);
                    if (sVar7 == 1) {
                      local_ac = (ref_grid->twod == 0) + 2;
                      sVar7 = fwrite(&local_ac,4,1,pFVar8);
                      if (sVar7 == 1) {
                        local_160 = pFVar8;
                        sVar7 = fwrite(&local_190,4,1,pFVar8);
                        if (sVar7 == 1) {
                          sVar7 = fwrite(&local_17c,4,1,local_160);
                          if (sVar7 == 1) {
                            sVar7 = fwrite(&local_16c,4,1,local_160);
                            if (sVar7 == 1) {
                              sVar7 = fwrite(&local_118,4,1,local_160);
                              if (sVar7 == 1) {
                                uVar16 = pRVar21->old_n_global;
                                pFVar8 = local_160;
                                goto LAB_00136363;
                              }
                              pcVar17 = "doubles";
                              sVar11 = 1;
                              uVar12 = 0x629;
                            }
                            else {
                              pcVar17 = "dof";
                              sVar11 = 1;
                              uVar12 = 0x628;
                            }
                          }
                          else {
                            pcVar17 = "steps";
                            sVar11 = 1;
                            uVar12 = 0x627;
                          }
                        }
                        else {
                          pcVar17 = "variables";
                          sVar11 = 1;
                          uVar12 = 0x626;
                        }
                      }
                      else {
                        pcVar17 = "dim";
                        sVar11 = 1;
                        uVar12 = 0x625;
                      }
                    }
                    else {
                      pcVar17 = "version";
                      sVar11 = 1;
                      uVar12 = 0x622;
                    }
                  }
                  else {
                    pcVar17 = "magic";
                    uVar12 = 0x621;
                  }
                }
                else {
                  pcVar17 = "length";
                  sVar11 = 1;
                  uVar12 = 0x61f;
                }
                goto LAB_001369d0;
              }
              pFVar8 = (FILE *)0x0;
LAB_00136363:
              uVar4 = local_190;
              uVar15 = (ulong)local_190;
              uVar5 = (int)((long)uVar16 / (long)pRVar9->n) + 1;
              uVar3 = uVar5;
              if ((0 < pRVar9->reduce_byte_limit) &&
                 (uVar3 = pRVar9->reduce_byte_limit / (int)(local_190 * 8 + 8),
                 (int)uVar5 < (int)uVar3)) {
                uVar3 = uVar5;
              }
              local_168 = CONCAT44(local_168._4_4_,local_190 + 1);
              uVar5 = uVar3 * (local_190 + 1);
              if (-1 < (int)uVar5) {
                sVar7 = (ulong)uVar5 << 3;
                local_160 = pFVar8;
                local_150 = uVar16;
                local_11c = uVar5;
                local_108 = (ulong)uVar3;
                local_148 = malloc(sVar7);
                if (local_148 == (void *)0x0) {
                  pcVar17 = "malloc local_xyzm of REF_DBL NULL";
                  uVar12 = 0x631;
                }
                else {
                  local_d0 = sVar7;
                  local_138 = malloc(sVar7);
                  if (local_138 != (void *)0x0) {
                    local_120 = local_17c;
                    local_130 = uVar15;
                    if (0 < (int)local_17c) {
                      lVar10 = (long)(int)local_108;
                      local_c0 = (local_168 & 0xffffffff) << 3;
                      local_c8 = uVar15 * 8;
                      local_e0 = (long)(int)local_168;
                      local_f8 = (undefined8 *)((long)local_148 + (long)(int)uVar4 * 8);
                      local_e8 = (void *)((long)local_138 + (long)(int)uVar4 * 8);
                      local_b8 = local_e0 * 8;
                      uVar16 = 0;
                      local_140 = 0;
                      uVar23 = local_150;
                      uVar19 = local_108;
                      local_158 = pRVar21;
                      local_128 = pRVar9;
                      local_100 = lVar10;
                      local_f0 = uVar15;
                      do {
                        if (0 < (long)uVar23) {
                          lVar13 = 0;
                          do {
                            local_150 = uVar23 - lVar13;
                            if (lVar10 < (long)(uVar23 - lVar13)) {
                              local_150 = uVar19;
                            }
                            local_150 = local_150 & 0xffffffff;
                            if (local_11c != 0) {
                              memset(local_148,0,local_d0);
                            }
                            uVar15 = local_150 & 0xffffffff;
                            local_110 = lVar13;
                            local_d8 = uVar15;
                            if (0 < (int)local_150) {
                              uVar23 = 0;
                              puVar22 = local_f8;
                              do {
                                uVar3 = ref_node_local(local_158,lVar13,(REF_INT *)&local_188);
                                if ((uVar3 != 0) && (uVar3 != 5)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0x642,"ref_gather_scalar_rst",(ulong)uVar3,
                                         "node local failed");
                                  uVar16 = (ulong)uVar3;
                                }
                                pvVar14 = (void *)((long)local_148 + uVar23 * 8);
                                if (uVar3 == 5) {
LAB_001365cc:
                                  if (-1 < (int)local_130) {
                                    memset(pvVar14,0,local_c0);
                                  }
                                }
                                else {
                                  if (uVar3 != 0) {
                                    if ((int)uVar16 == 0) {
                                      return 0;
                                    }
                                    goto LAB_001369dc;
                                  }
                                  if (local_128->id != local_158->part[(int)local_188])
                                  goto LAB_001365cc;
                                  if (0 < (int)local_130) {
                                    memcpy(pvVar14,local_178 + (long)(int)local_188 * (long)ldim,
                                           local_c8);
                                  }
                                  *puVar22 = 0x3ff0000000000000;
                                }
                                puVar22 = (undefined8 *)((long)puVar22 + local_b8);
                                lVar13 = lVar13 + 1;
                                uVar23 = (ulong)(uint)((int)uVar23 + (int)local_168);
                                uVar15 = uVar15 - 1;
                              } while (uVar15 != 0);
                            }
                            iVar2 = (int)local_150;
                            uVar3 = ref_mpi_sum(local_128,local_148,local_138,iVar2 * (int)local_168
                                                ,3);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x650,"ref_gather_scalar_rst",(ulong)uVar3,"sum");
                              uVar16 = (ulong)uVar3;
                              goto LAB_001369dc;
                            }
                            if ((0 < iVar2) && (local_128->id == 0)) {
                              uVar15 = 0;
                              uVar23 = 0;
                              do {
                                dVar25 = *(double *)((long)local_e8 + uVar23 * local_e0 * 8) + -1.0;
                                if (dVar25 <= -dVar25) {
                                  dVar25 = -dVar25;
                                }
                                if (0.1 < dVar25) {
                                  printf("error gather node %ld %f\n");
                                }
                                if (0 < (int)local_130) {
                                  pvVar14 = (void *)((long)local_138 + uVar15 * 8);
                                  uVar19 = local_f0;
                                  do {
                                    sVar7 = fwrite(pvVar14,8,1,local_160);
                                    if (sVar7 != 1) {
                                      pcVar17 = "s";
                                      sVar11 = 1;
                                      uVar12 = 0x65c;
                                      goto LAB_001369d0;
                                    }
                                    pvVar14 = (void *)((long)pvVar14 + 8);
                                    uVar19 = uVar19 - 1;
                                  } while (uVar19 != 0);
                                }
                                uVar23 = uVar23 + 1;
                                uVar15 = (ulong)(uint)((int)uVar15 + (int)local_168);
                              } while (uVar23 != local_d8);
                            }
                            lVar13 = local_110 + (int)local_150;
                            uVar23 = local_158->old_n_global;
                            uVar19 = local_108;
                            lVar10 = local_100;
                          } while (lVar13 < (long)uVar23);
                        }
                        local_140 = local_140 + 1;
                      } while (local_140 != local_120);
                    }
                    free(local_138);
                    free(local_148);
                    iVar2 = ref_grid->mpi->id;
                    pFVar8 = local_160;
                    goto joined_r0x0013676c;
                  }
                  pcVar17 = "malloc xyzm of REF_DBL NULL";
                  uVar12 = 0x632;
                }
LAB_001377b9:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar12,"ref_gather_scalar_rst",pcVar17);
                uVar16 = 2;
                goto LAB_001369dc;
              }
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x631,"ref_gather_scalar_rst","malloc local_xyzm of REF_DBL negative");
            }
            else {
              sVar7 = (size_t)(int)uVar3;
              sVar11 = (size_t)ldim;
              pcVar17 = "ldim not divisble by steps";
              uVar12 = 0x610;
LAB_001369d0:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar12,"ref_gather_scalar_rst",pcVar17,sVar11,sVar7);
            }
            uVar16 = 1;
          }
          else {
            uVar16 = (ulong)uVar3;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x60d,"ref_gather_scalar_rst",(ulong)uVar3,"sync");
          }
LAB_001369dc:
          pcVar17 = "scalar rst";
          uVar12 = 0x1136;
          goto LAB_00135eb3;
        }
        pRVar21 = ref_grid->node;
        uVar3 = ref_node_synchronize_globals(pRVar21);
        if (uVar3 == 0) {
          if (ref_grid->mpi->id != 0) {
            pFVar8 = (FILE *)0x0;
LAB_001372a9:
            uVar3 = ref_gather_node_scalar_txt(pRVar21,ldim,local_178," ",1,(FILE *)pFVar8);
            if (uVar3 != 0) {
              pcVar17 = "text export";
              uVar12 = 0xd28;
              goto LAB_001372f2;
            }
            iVar2 = ref_grid->mpi->id;
            goto joined_r0x00137330;
          }
          pFVar8 = fopen(filename,"w");
          if (pFVar8 != (FILE *)0x0) {
            fwrite("# .PCD v.7 - Point Cloud Data file format\n",0x2a,1,pFVar8);
            fwrite("VERSION .7\n",0xb,1,pFVar8);
            fwrite("FIELDS x y z",0xc,1,pFVar8);
            if (scalar_names == (char **)0x0) {
              if (0 < ldim) {
                uVar3 = 1;
                do {
                  fprintf(pFVar8," V%d",(ulong)uVar3);
                  bVar24 = uVar3 != ldim;
                  uVar3 = uVar3 + 1;
                } while (bVar24);
              }
            }
            else if (0 < ldim) {
              uVar15 = 0;
              do {
                fprintf(pFVar8," %s",scalar_names[uVar15]);
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
            fputc(10,pFVar8);
            fwrite("SIZE",4,1,pFVar8);
            iVar2 = ldim + 3;
            if (ldim < -2) {
              fputc(10,pFVar8);
              fwrite("TYPE",4,1,pFVar8);
            }
            else {
              iVar18 = 1;
              iVar20 = 1;
              if (1 < iVar2) {
                iVar18 = iVar2;
                iVar20 = iVar2;
              }
              do {
                fwrite(" 4",2,1,pFVar8);
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
              fputc(10,pFVar8);
              fwrite("TYPE",4,1,pFVar8);
              do {
                fwrite(" F",2,1,pFVar8);
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            fputc(10,pFVar8);
            fwrite("COUNT",5,1,pFVar8);
            if (-3 < ldim) {
              iVar18 = 1;
              if (1 < iVar2) {
                iVar18 = iVar2;
              }
              do {
                fwrite(" 1",2,1,pFVar8);
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            fputc(10,pFVar8);
            fprintf(pFVar8,"WIDTH %ld\n",pRVar21->old_n_global);
            fwrite("VIEWPOINT 0 0 0 1 0 0 0\n",0x18,1,pFVar8);
            fprintf(pFVar8,"POINTS %ld\n",pRVar21->old_n_global);
            fwrite("DATA ascii\n",0xb,1,pFVar8);
            goto LAB_001372a9;
          }
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xd0e,"ref_gather_scalar_pcd","unable to open file");
          uVar16 = 2;
        }
        else {
          pcVar17 = "sync";
          uVar12 = 0xd08;
LAB_001372f2:
          uVar16 = (ulong)uVar3;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar12,"ref_gather_scalar_pcd",uVar16,pcVar17);
        }
        pcVar17 = "scalar pcd";
        uVar12 = 0x1132;
        goto LAB_00135eb3;
      }
LAB_001357bf:
      if ((sVar7 < 0xd) || (iVar2 = strcmp(pcVar17 + -0xc,".restart_sol"), iVar2 != 0)) {
        if ((bVar24) && (iVar2 = strcmp(pcVar17 + -4,".sol"), iVar2 == 0)) {
          uVar3 = ref_node_synchronize_globals(ref_grid->node);
          if (uVar3 != 0) {
            uVar16 = (ulong)uVar3;
            pcVar17 = "sync";
            uVar12 = 0xc3d;
LAB_00136ce0:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar12,"ref_gather_scalar_sol",uVar16,pcVar17);
LAB_00136cea:
            pcVar17 = "scalar sol";
            uVar12 = 0x1140;
            goto LAB_00135eb3;
          }
          pRVar9 = ref_grid->mpi;
          if (pRVar9->id == 0) {
            pFVar8 = fopen(filename,"w");
            if (pFVar8 != (FILE *)0x0) {
              pRVar9 = ref_grid->mpi;
              goto LAB_00136aad;
            }
            printf("unable to open %s\n",filename);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc43,"ref_gather_scalar_sol","unable to open file");
            uVar16 = 2;
            goto LAB_00136cea;
          }
          pFVar8 = (FILE *)0x0;
LAB_00136aad:
          pRVar21 = ref_grid->node;
          uVar3 = ref_node_synchronize_globals(pRVar21);
          if (uVar3 != 0) {
            pcVar17 = "sync";
            uVar12 = 0x768;
LAB_00136cb5:
            uVar16 = (ulong)uVar3;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar12,"ref_gather_node_scalar_sol",uVar16,pcVar17);
            pcVar17 = "nodes";
            uVar12 = 0xc46;
            goto LAB_00136ce0;
          }
          if (pRVar9->id == 0) {
            iVar2 = ref_grid->twod;
            fprintf(pFVar8,"MeshVersionFormatted %d\n\n",2);
            fprintf(pFVar8,"Dimension %d\n\n",(ulong)((iVar2 == 0) + 2));
            if (pRVar9->id == 0) {
              fwrite("SolAtVertices\n",0xe,1,pFVar8);
              fprintf(pFVar8,"%ld\n",pRVar21->old_n_global);
              fprintf(pFVar8,"%d",uVar16);
              if (0 < ldim) {
                do {
                  fprintf(pFVar8," %d",1);
                  uVar3 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar3;
                } while (uVar3 != 0);
              }
              fputc(10,pFVar8);
            }
          }
          uVar3 = ref_gather_node_scalar_txt(pRVar21,ldim,local_178," ",0,(FILE *)pFVar8);
          if (uVar3 != 0) {
            pcVar17 = "txt dump in solb";
            uVar12 = 0x77f;
            goto LAB_00136cb5;
          }
          if (pRVar9->id == 0) {
            fwrite("\nEnd\n",5,1,pFVar8);
          }
          pRVar9 = ref_grid->mpi;
LAB_0013752c:
          iVar2 = pRVar9->id;
joined_r0x00137330:
          if (iVar2 != 0) {
            return 0;
          }
LAB_0013753b:
          fclose(pFVar8);
          return 0;
        }
        if (sVar7 < 0x10) {
          if (5 < sVar7) goto LAB_00135a14;
        }
        else {
          iVar2 = strcmp(pcVar17 + -0xf,"-usm3dcell.solb");
          if (iVar2 == 0) {
            uVar3 = ref_gather_scalar_cell_solb(ref_grid,ldim,local_178,filename);
            if (uVar3 == 0) {
              return 0;
            }
            uVar16 = (ulong)uVar3;
            pcVar17 = "scalar usm3d cell solb";
            uVar12 = 0x1146;
            goto LAB_00135eb3;
          }
LAB_00135a14:
          iVar2 = strcmp(pcVar17 + -5,".solb");
          if (iVar2 == 0) {
            uVar3 = ref_node_synchronize_globals(ref_grid->node);
            if (uVar3 == 0) {
              pRVar9 = ref_grid->mpi;
              if (pRVar9->id != 0) {
                pFVar8 = (FILE *)0x0;
LAB_00136b0d:
                pRVar21 = ref_grid->node;
                uVar3 = ref_node_synchronize_globals(pRVar21);
                if (uVar3 != 0) {
                  uVar16 = (ulong)uVar3;
                  pcVar17 = "sync";
                  uVar12 = 0x71e;
                  goto LAB_00136b47;
                }
                local_17c = (ref_grid->twod == 0) + 2;
                local_190 = 2;
                uVar3 = ref_grid->meshb_version;
                if ((int)uVar3 < 2) {
                  if (10000000 < pRVar21->old_n_global) {
                    uVar3 = 4 - ((ulong)pRVar21->old_n_global < 0xbebc201);
                    goto LAB_00136dc6;
                  }
                  uVar4 = 8;
                  iVar2 = 4;
                }
                else {
LAB_00136dc6:
                  iVar2 = (uint)(3 < uVar3) * 4 + 4;
                  uVar4 = (uint)(2 < uVar3) * 4 + 8;
                  local_190 = uVar3;
                }
                if (pRVar9->id != 0) {
                  sVar7 = 0;
                  uVar3 = local_190;
                  goto LAB_001375bc;
                }
                local_158 = (REF_NODE)CONCAT44(local_158._4_4_,iVar2);
                local_188._0_4_ = 1;
                sVar11 = fwrite(&local_188,4,1,pFVar8);
                if (sVar11 == 1) {
                  sVar11 = fwrite(&local_190,4,1,pFVar8);
                  if (sVar11 != 1) {
                    pcVar17 = "version";
                    sVar7 = 1;
                    uVar12 = 0x734;
                    goto LAB_00137970;
                  }
                  lVar10 = ftell(pFVar8);
                  local_a8 = CONCAT44(local_a8._4_4_,3);
                  sVar11 = fwrite(&local_a8,4,1,pFVar8);
                  uVar3 = local_190;
                  if (sVar11 != 1) {
                    pcVar17 = "dim code";
                    sVar7 = 1;
                    uVar12 = 0x737;
                    goto LAB_00137970;
                  }
                  local_168 = (ulong)uVar4 + lVar10 + 4;
                  uVar5 = ref_export_meshb_next_position((FILE *)pFVar8,local_190,local_168);
                  if (uVar5 != 0) {
                    uVar16 = (ulong)uVar5;
                    pcVar17 = "next p";
                    uVar12 = 0x738;
                    goto LAB_00136b47;
                  }
                  sVar11 = fwrite(&local_17c,4,1,pFVar8);
                  if (sVar11 != 1) {
                    pcVar17 = "dim";
                    sVar7 = 1;
                    uVar12 = 0x739;
                    goto LAB_00137970;
                  }
                  sVar11 = ftell(pFVar8);
                  sVar7 = local_168;
                  if (local_168 != sVar11) {
                    pcVar17 = "dim inconsistent";
                    uVar12 = 0x73a;
                    goto LAB_00137970;
                  }
                  if (pRVar9->id != 0) {
LAB_001375bc:
                    uVar4 = ref_gather_node_scalar_bin(pRVar21,ldim,local_178,(FILE *)pFVar8);
                    if (uVar4 != 0) {
                      uVar16 = (ulong)uVar4;
                      pcVar17 = "bin dump in solb";
                      uVar12 = 0x750;
                      goto LAB_00136b47;
                    }
                    if (pRVar9->id == 0) {
                      sVar11 = ftell(pFVar8);
                      if (sVar7 != sVar11) {
                        pcVar17 = "solb metric record len inconsistent";
                        uVar12 = 0x753;
                        goto LAB_00137970;
                      }
                      if (pRVar9->id == 0) {
                        local_a8 = CONCAT44(local_a8._4_4_,0x36);
                        sVar11 = fwrite(&local_a8,4,1,pFVar8);
                        if (sVar11 != 1) {
                          pcVar17 = "end kw";
                          uVar12 = 0x757;
                          sVar7 = 1;
                          goto LAB_00137970;
                        }
                        uVar3 = ref_export_meshb_next_position((FILE *)pFVar8,uVar3,0);
                        if (uVar3 != 0) {
                          uVar16 = (ulong)uVar3;
                          pcVar17 = "next p";
                          uVar12 = 0x759;
                          goto LAB_00136b47;
                        }
                      }
                    }
                    iVar2 = ref_grid->mpi->id;
                    goto joined_r0x00137330;
                  }
                  lVar10 = pRVar21->old_n_global;
                  local_168 = ftell(pFVar8);
                  local_a8 = CONCAT44(local_a8._4_4_,0x3e);
                  sVar11 = fwrite(&local_a8,4,1,pFVar8);
                  if (sVar11 != 1) {
                    pcVar17 = "vertex version code";
                    uVar12 = 0x743;
                    sVar7 = 1;
                    goto LAB_00137970;
                  }
                  local_168 = local_168 +
                              (long)(ldim * 4) + (ulong)(uVar4 + (int)local_158) +
                              (ldim * 8) * lVar10 + 4;
                  uVar4 = ref_export_meshb_next_position((FILE *)pFVar8,uVar3,local_168);
                  if (uVar4 == 0) {
                    RVar6 = ref_gather_meshb_glob((FILE *)pFVar8,uVar3,pRVar21->old_n_global);
                    if (RVar6 == 0) {
                      local_a8 = CONCAT44(local_a8._4_4_,ldim);
                      sVar11 = fwrite(&local_a8,4,1,pFVar8);
                      if (sVar11 == 1) {
                        local_a8 = CONCAT44(local_a8._4_4_,1);
                        sVar7 = local_168;
                        if (0 < ldim) {
                          do {
                            sVar11 = fwrite(&local_a8,4,1,pFVar8);
                            if (sVar11 != 1) {
                              pcVar17 = "scalar";
                              uVar12 = 0x74b;
                              sVar7 = 1;
                              goto LAB_00137970;
                            }
                            uVar4 = (int)uVar16 - 1;
                            uVar16 = (ulong)uVar4;
                            sVar7 = local_168;
                          } while (uVar4 != 0);
                        }
                        goto LAB_001375bc;
                      }
                      pcVar17 = "n solutions";
                      uVar12 = 0x748;
                      sVar7 = 1;
                      goto LAB_00137970;
                    }
                    pcVar17 = "nnode";
                    uVar12 = 0x746;
                    uVar16 = 1;
                  }
                  else {
                    uVar16 = (ulong)uVar4;
                    pcVar17 = "next p";
                    uVar12 = 0x744;
                  }
LAB_00136b47:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar12,"ref_gather_node_scalar_solb",uVar16,pcVar17);
                }
                else {
                  pcVar17 = "code";
                  sVar7 = 1;
                  uVar12 = 0x733;
LAB_00137970:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar12,"ref_gather_node_scalar_solb",pcVar17,sVar7,sVar11);
                  uVar16 = 1;
                }
                pcVar17 = "nodes";
                uVar12 = 0xc08;
                goto LAB_00136b6f;
              }
              pFVar8 = fopen(filename,"w");
              if (pFVar8 != (FILE *)0x0) {
                pRVar9 = ref_grid->mpi;
                goto LAB_00136b0d;
              }
              printf("unable to open %s\n",filename);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc05,"ref_gather_scalar_solb","unable to open file");
              uVar16 = 2;
            }
            else {
              uVar16 = (ulong)uVar3;
              pcVar17 = "sync";
              uVar12 = 0xbff;
LAB_00136b6f:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar12,"ref_gather_scalar_solb",uVar16,pcVar17);
            }
            pcVar17 = "scalar solb";
            uVar12 = 0x114b;
            goto LAB_00135eb3;
          }
        }
        if (!bVar24) {
LAB_00135a7f:
          printf("%s: %d: %s %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x115c,"input file name extension unknown",filename);
          return 1;
        }
        pcVar17 = pcVar17 + -4;
        iVar2 = strcmp(pcVar17,".bin");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar17,".txt");
          if (iVar2 == 0) {
            uVar3 = ref_gather_scalar_txt(ref_grid,ldim,local_178," ",filename);
            if (uVar3 == 0) {
              return 0;
            }
            uVar16 = (ulong)uVar3;
            pcVar17 = "scalar txt";
            uVar12 = 0x1154;
          }
          else {
            iVar2 = strcmp(pcVar17,".csv");
            if (iVar2 != 0) goto LAB_00135a7f;
            uVar3 = ref_gather_scalar_txt(ref_grid,ldim,local_178,",",filename);
            if (uVar3 == 0) {
              return 0;
            }
            uVar16 = (ulong)uVar3;
            pcVar17 = "scalar txt";
            uVar12 = 0x1159;
          }
          goto LAB_00135eb3;
        }
        pRVar21 = ref_grid->node;
        uVar3 = ref_node_synchronize_globals(pRVar21);
        if (uVar3 == 0) {
          if (ref_grid->mpi->id != 0) {
            pFVar8 = (FILE *)0x0;
LAB_00137064:
            uVar3 = ref_gather_node_scalar_bin(pRVar21,ldim,local_178,(FILE *)pFVar8);
            if (uVar3 == 0) {
              pRVar9 = ref_grid->mpi;
              goto LAB_0013752c;
            }
            pcVar17 = "nodes";
            uVar12 = 0xbf2;
            goto LAB_0013709e;
          }
          pFVar8 = fopen(filename,"w");
          if (pFVar8 != (FILE *)0x0) goto LAB_00137064;
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xbef,"ref_gather_scalar_bin","unable to open file");
          uVar16 = 2;
        }
        else {
          pcVar17 = "sync";
          uVar12 = 0xbe9;
LAB_0013709e:
          uVar16 = (ulong)uVar3;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar12,"ref_gather_scalar_bin",uVar16,pcVar17);
        }
        pcVar17 = "scalar bin";
        uVar12 = 0x114f;
        goto LAB_00135eb3;
      }
      if (ref_grid->mpi->n < 2) {
        if (ldim != 5) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xc17,"ref_gather_scalar_cell_restart_sol","only implemented for ldim=5",5,
                 (long)ldim);
          goto LAB_001367dc;
        }
        pRVar1 = ref_grid->cell[3];
        pFVar8 = fopen(filename,"w");
        if (pFVar8 != (FILE *)0x0) {
          fprintf(pFVar8,"%d\n",(ulong)(uint)pRVar1->n);
          if (0 < pRVar1->max) {
            iVar2 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar1,iVar2,(REF_INT *)&local_a8);
              if (RVar6 == 0) {
                iVar18 = pRVar1->node_per;
                dVar25 = 0.0;
                dVar26 = 0.0;
                if ((long)iVar18 < 1) {
                  dVar27 = 0.0;
                }
                else {
                  lVar10 = 0;
                  dVar27 = 0.0;
                  do {
                    lVar13 = (long)*(int *)((long)&local_a8 + lVar10 * 4);
                    dVar25 = dVar25 + local_178[lVar13 * 5];
                    dVar26 = dVar26 + (local_178 + lVar13 * 5)[1];
                    dVar27 = dVar27 + local_178[lVar13 * 5 + 3];
                    lVar10 = lVar10 + 1;
                  } while (iVar18 != lVar10);
                }
                dVar28 = (double)iVar18;
                fprintf(pFVar8,"%.15e %.15e %.15e %.15e\n",dVar25 / dVar28,dVar26 / dVar28,
                        dVar27 / dVar28);
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 < pRVar1->max);
          }
          goto LAB_0013753b;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc1b,"ref_gather_scalar_cell_restart_sol","unable to open file");
        uVar16 = 2;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc16,"ref_gather_scalar_cell_restart_sol","only implemented for single core");
LAB_001367dc:
        uVar16 = 1;
      }
      pcVar17 = "scalar sol";
      uVar12 = 0x113c;
      goto LAB_00135eb3;
    }
  }
  else {
LAB_0013570d:
    pcVar17 = filename + (sVar7 - 4);
    iVar2 = strcmp(pcVar17,".plt");
    if (iVar2 == 0) {
      uVar3 = ref_gather_scalar_plt(ref_grid,ldim,local_178,scalar_names,0,filename);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1124,"ref_gather_scalar_by_extension",(ulong)uVar3,"scalar tec");
        return uVar3;
      }
      return 0;
    }
    iVar2 = strcmp(pcVar17,".tec");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar17,".dat");
      bVar24 = true;
      if (iVar2 != 0) goto LAB_0013576a;
    }
  }
  pRVar21 = ref_grid->node;
  if (ref_grid->mpi->id == 0) {
    pFVar8 = fopen(filename,"w");
    if (pFVar8 != (FILE *)0x0) {
      fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar8);
      fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar8);
      if (scalar_names == (char **)0x0) {
        if (0 < ldim) {
          uVar3 = 1;
          do {
            fprintf(pFVar8," \"V%d\"",(ulong)uVar3);
            bVar24 = uVar3 != ldim;
            uVar3 = uVar3 + 1;
          } while (bVar24);
        }
      }
      else if (0 < ldim) {
        uVar15 = 0;
        do {
          fprintf(pFVar8," \"%s\"",scalar_names[uVar15]);
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
      fputc(10,pFVar8);
      goto LAB_00135cc6;
    }
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xd40,
           "ref_gather_scalar_tec","unable to open file");
    uVar16 = 2;
  }
  else {
    pFVar8 = (FILE *)0x0;
LAB_00135cc6:
    uVar3 = ref_node_synchronize_globals(pRVar21);
    if (uVar3 == 0) {
      uVar3 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_17c,&local_16c);
      if (uVar3 == 0) {
        if ((int)local_17c <= local_16c) {
          uVar3 = local_17c;
          do {
            pRVar1 = ref_grid->cell[3];
            uVar4 = ref_grid_compact_cell_id_nodes
                              (ref_grid,pRVar1,uVar3,&local_a8,(REF_LONG *)&local_190,
                               (REF_GLOB **)&local_188);
            if (uVar4 != 0) {
              uVar16 = (ulong)uVar4;
              pcVar17 = "l2c";
              uVar12 = 0xd53;
              goto LAB_00135d32;
            }
            if (0 < CONCAT44(uStack_18c,local_190) && 0 < local_a8) {
              if (ref_grid->mpi->id == 0) {
                fprintf(pFVar8,
                        "zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                        (ulong)uVar3,local_a8,CONCAT44(uStack_18c,local_190),"point","fetriangle");
              }
              uVar4 = ref_gather_node_tec_part
                                (pRVar21,local_a8,
                                 (REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),ldim,local_178
                                 ,(FILE *)pFVar8);
              if (uVar4 != 0) {
                uVar16 = (ulong)uVar4;
                pcVar17 = "nodes";
                uVar12 = 0xd5d;
                goto LAB_00135d32;
              }
              uVar4 = ref_gather_cell_id_tec
                                (pRVar21,pRVar1,uVar3,CONCAT44(uStack_18c,local_190),
                                 (REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),0,
                                 (FILE *)pFVar8);
              if (uVar4 != 0) {
                uVar16 = (ulong)uVar4;
                pcVar17 = "t";
                uVar12 = 0xd60;
                goto LAB_00135d32;
              }
            }
            if ((void *)CONCAT44(local_188._4_4_,(int)local_188) != (void *)0x0) {
              free((void *)CONCAT44(local_188._4_4_,(int)local_188));
            }
            pRVar1 = ref_grid->cell[6];
            uVar4 = ref_grid_compact_cell_id_nodes
                              (ref_grid,pRVar1,uVar3,&local_a8,(REF_LONG *)&local_190,
                               (REF_GLOB **)&local_188);
            if (uVar4 != 0) {
              uVar16 = (ulong)uVar4;
              pcVar17 = "l2c";
              uVar12 = 0xd67;
              goto LAB_00135d32;
            }
            if (0 < CONCAT44(uStack_18c,local_190) && 0 < local_a8) {
              if (ref_grid->mpi->id == 0) {
                fprintf(pFVar8,
                        "zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                        (ulong)uVar3,local_a8,CONCAT44(uStack_18c,local_190),"point",
                        "fequadrilateral");
              }
              uVar4 = ref_gather_node_tec_part
                                (pRVar21,local_a8,
                                 (REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),ldim,local_178
                                 ,(FILE *)pFVar8);
              if (uVar4 != 0) {
                uVar16 = (ulong)uVar4;
                pcVar17 = "nodes";
                uVar12 = 0xd71;
                goto LAB_00135d32;
              }
              uVar4 = ref_gather_cell_id_tec
                                (pRVar21,pRVar1,uVar3,CONCAT44(uStack_18c,local_190),
                                 (REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),0,
                                 (FILE *)pFVar8);
              if (uVar4 != 0) {
                uVar16 = (ulong)uVar4;
                pcVar17 = "t";
                uVar12 = 0xd74;
                goto LAB_00135d32;
              }
            }
            if ((void *)CONCAT44(local_188._4_4_,(int)local_188) != (void *)0x0) {
              free((void *)CONCAT44(local_188._4_4_,(int)local_188));
            }
            bVar24 = (int)uVar3 < local_16c;
            uVar3 = uVar3 + 1;
          } while (bVar24);
        }
        pRVar1 = ref_grid->cell[8];
        uVar3 = ref_grid_compact_cell_nodes
                          (ref_grid,pRVar1,&local_a8,(REF_LONG *)&local_190,(REF_GLOB **)&local_188)
        ;
        if (uVar3 == 0) {
          if (CONCAT44(uStack_18c,local_190) < 1 || local_a8 < 1) {
LAB_001374d8:
            if ((void *)CONCAT44(local_188._4_4_,(int)local_188) != (void *)0x0) {
              free((void *)CONCAT44(local_188._4_4_,(int)local_188));
            }
            goto LAB_001374e7;
          }
          if (ref_grid->mpi->id == 0) {
            fprintf(pFVar8,"zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    local_a8,CONCAT44(uStack_18c,local_190),"point","fetetrahedron");
          }
          uVar3 = ref_gather_node_tec_part
                            (pRVar21,local_a8,(REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),
                             ldim,local_178,(FILE *)pFVar8);
          if (uVar3 == 0) {
            uVar3 = ref_gather_cell_tec(pRVar21,pRVar1,CONCAT44(uStack_18c,local_190),
                                        (REF_GLOB *)CONCAT44(local_188._4_4_,(int)local_188),0,
                                        (FILE *)pFVar8);
            if (uVar3 == 0) goto LAB_001374d8;
            uVar16 = (ulong)uVar3;
            pcVar17 = "t";
            uVar12 = 0xd87;
          }
          else {
            uVar16 = (ulong)uVar3;
            pcVar17 = "nodes";
            uVar12 = 0xd85;
          }
        }
        else {
          uVar16 = (ulong)uVar3;
          pcVar17 = "l2c";
          uVar12 = 0xd7b;
        }
      }
      else {
        uVar16 = (ulong)uVar3;
        pcVar17 = "range";
        uVar12 = 0xd4d;
      }
    }
    else {
      uVar16 = (ulong)uVar3;
      pcVar17 = "sync";
      uVar12 = 0xd4b;
    }
LAB_00135d32:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar12
           ,"ref_gather_scalar_tec",uVar16,pcVar17);
  }
  pcVar17 = "scalar tec";
  uVar12 = 0x112d;
LAB_00135eb3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar12,
         "ref_gather_scalar_by_extension",uVar16,pcVar17);
  return (REF_STATUS)uVar16;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_by_extension(REF_GRID ref_grid,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  const char **scalar_names,
                                                  const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], "-edge.tec") == 0) {
    RSS(ref_gather_scalar_edge_tec(ref_grid, ldim, scalar, scalar_names,
                                   filename),
        "scalar edge tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], "-brick.plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_TRUE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_FALSE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if ((end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".tec") == 0) ||
      (end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".dat") == 0) ||
      (end_of_string > 2 && strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_scalar_tec(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".pcd") == 0) {
    RSS(ref_gather_scalar_pcd(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar pcd");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_gather_scalar_rst(ref_grid, ldim, scalar, filename), "scalar rst");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_gather_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_gather_scalar_sol(ref_grid, ldim, scalar, filename), "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 15 &&
      strcmp(&filename[end_of_string - 15], "-usm3dcell.solb") == 0) {
    RSS(ref_gather_scalar_cell_solb(ref_grid, ldim, scalar, filename),
        "scalar usm3d cell solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_gather_scalar_solb(ref_grid, ldim, scalar, filename),
        "scalar solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".bin") == 0) {
    RSS(ref_gather_scalar_bin(ref_grid, ldim, scalar, filename), "scalar bin");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".txt") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, " ", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".csv") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, ",", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  return REF_FAILURE;
}